

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O1

SimulationResult * __thiscall
SimulationDecPOMDPDiscrete::RunSimulations
          (SimulationResult *__return_storage_ptr__,SimulationDecPOMDPDiscrete *this,
          JointPolicyDiscrete *jp)

{
  ostream *poVar1;
  int iVar2;
  double in_XMM0_Qa;
  
  SimulationResult::SimulationResult
            (__return_storage_ptr__,(int)this->_m_horizon,(this->super_Simulation)._m_random_seed,
             (this->super_Simulation)._m_nrRuns);
  if (0 < (this->super_Simulation)._m_nrRuns) {
    iVar2 = 0;
    do {
      (*(this->super_Simulation)._vptr_Simulation[2])(this,jp);
      if ((this->super_Simulation)._m_verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Run ended r=",0xc)
        ;
        poVar1 = std::ostream::_M_insert<double>(in_XMM0_Qa);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
      }
      SimulationResult::AddReward(__return_storage_ptr__,in_XMM0_Qa);
      iVar2 = iVar2 + 1;
    } while (iVar2 < (this->super_Simulation)._m_nrRuns);
  }
  return __return_storage_ptr__;
}

Assistant:

SimulationResult
SimulationDecPOMDPDiscrete::RunSimulations(const JointPolicyDiscrete *jp) const
{
    SimulationResult result(_m_horizon,GetRandomSeed(),GetNrRuns());
#if 0
    if(GetVerbose())
        jp->Print();
#endif
    // Run the simulations
    int i;
    for(i=0;i<GetNrRuns();i++)
    {
        double res = RunSimulation(jp);
        if(GetVerbose())
            cout << "Run ended r="<<res<<endl;
        result.AddReward(res);
    }

    return(result);
}